

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_question
          (xml_parser *this,char_t *s,xml_node_struct **ref_cursor,uint optmsk,char_t endch)

{
  byte bVar1;
  xml_node_struct **ppxVar2;
  int iVar3;
  bool bVar4;
  bool local_70;
  bool local_6c;
  uint local_68;
  char_t *value;
  bool declaration;
  char_t *target;
  xml_node_struct *pxStack_38;
  char_t ch;
  xml_node_struct *cursor;
  char_t endch_local;
  uint optmsk_local;
  xml_node_struct **ref_cursor_local;
  char_t *s_local;
  xml_parser *this_local;
  
  pxStack_38 = *ref_cursor;
  ppxVar2 = (xml_node_struct **)(s + 1);
  ref_cursor_local = ppxVar2;
  if (((anonymous_namespace)::chartype_table[*(byte *)ppxVar2] & 0x80) == 0) {
    this->error_offset = (char_t *)ppxVar2;
    this->error_status = status_bad_pi;
    this_local = (xml_parser *)0x0;
  }
  else {
    while (((anonymous_namespace)::chartype_table[*(byte *)ref_cursor_local] & 0x40) != 0) {
      ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + 1);
    }
    if (*(char *)ref_cursor_local == '\0') {
      this->error_offset = (char_t *)ref_cursor_local;
      this->error_status = status_bad_pi;
      this_local = (xml_parser *)0x0;
    }
    else {
      bVar4 = false;
      if ((((*(byte *)ppxVar2 | 0x20) == 0x78) && (bVar4 = false, (byte)(s[2] | 0x20U) == 0x6d)) &&
         (bVar4 = false, (byte)(s[3] | 0x20U) == 0x6c)) {
        bVar4 = (xml_node_struct **)(s + 4) == ref_cursor_local;
      }
      if (bVar4) {
        local_68 = optmsk & 0x100;
      }
      else {
        local_68 = optmsk & 1;
      }
      if (local_68 == 0) {
        while( true ) {
          local_70 = false;
          if (*(char *)ref_cursor_local != '\0') {
            local_70 = false;
            if ((*(char *)ref_cursor_local == '?') &&
               (local_70 = true, *(char *)((long)ref_cursor_local + 1) != '>')) {
              local_70 = *(char *)((long)ref_cursor_local + 1) == '\0' && endch == '>';
            }
            local_70 = (bool)(local_70 ^ 1);
          }
          if (!local_70) break;
          ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + 1);
        }
        if (*(char *)ref_cursor_local == '\0') {
          this->error_offset = (char_t *)ref_cursor_local;
          this->error_status = status_bad_pi;
          return (char_t *)0x0;
        }
        iVar3 = 1;
        if (*(char *)((long)ref_cursor_local + 1) == '>') {
          iVar3 = 2;
        }
        ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + (long)iVar3);
      }
      else {
        if (bVar4) {
          if (pxStack_38->parent != (xml_node_struct *)0x0) {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_bad_pi;
            return (char_t *)0x0;
          }
          pxStack_38 = append_new_node(pxStack_38,this->alloc,node_declaration);
          if (pxStack_38 == (xml_node_struct *)0x0) {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_out_of_memory;
            return (char_t *)0x0;
          }
        }
        else {
          pxStack_38 = append_new_node(pxStack_38,this->alloc,node_pi);
          if (pxStack_38 == (xml_node_struct *)0x0) {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_out_of_memory;
            return (char_t *)0x0;
          }
        }
        pxStack_38->name = (char_t *)ppxVar2;
        bVar1 = *(byte *)ref_cursor_local;
        *(undefined1 *)ref_cursor_local = 0;
        ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + 1);
        if (bVar1 == 0x3f) {
          if ((*(char *)ref_cursor_local != '>') &&
             ((*(char *)ref_cursor_local != '\0' || (endch != '>')))) {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_bad_pi;
            return (char_t *)0x0;
          }
          pxStack_38 = pxStack_38->parent;
          ref_cursor_local =
               (xml_node_struct **)
               ((long)ref_cursor_local + (long)(int)(uint)(*(char *)ref_cursor_local == '>'));
        }
        else {
          if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_bad_pi;
            return (char_t *)0x0;
          }
          while (ppxVar2 = ref_cursor_local,
                ((anonymous_namespace)::chartype_table[*(byte *)ref_cursor_local] & 8) != 0) {
            ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + 1);
          }
          while( true ) {
            local_6c = false;
            if (*(char *)ref_cursor_local != '\0') {
              local_6c = false;
              if ((*(char *)ref_cursor_local == '?') &&
                 (local_6c = true, *(char *)((long)ref_cursor_local + 1) != '>')) {
                local_6c = *(char *)((long)ref_cursor_local + 1) == '\0' && endch == '>';
              }
              local_6c = (bool)(local_6c ^ 1);
            }
            if (!local_6c) break;
            ref_cursor_local = (xml_node_struct **)((long)ref_cursor_local + 1);
          }
          if (*(char *)ref_cursor_local == '\0') {
            this->error_offset = (char_t *)ref_cursor_local;
            this->error_status = status_bad_pi;
            return (char_t *)0x0;
          }
          if (bVar4) {
            *(undefined1 *)ref_cursor_local = 0x2f;
            ref_cursor_local = ppxVar2;
          }
          else {
            pxStack_38->value = (char_t *)ppxVar2;
            pxStack_38 = pxStack_38->parent;
            *(undefined1 *)ref_cursor_local = 0;
            ref_cursor_local =
                 (xml_node_struct **)
                 ((char *)((long)ref_cursor_local + 1) +
                 (int)(uint)(*(char *)((long)ref_cursor_local + 1) == '>'));
          }
        }
      }
      *ref_cursor = pxStack_38;
      this_local = (xml_parser *)ref_cursor_local;
    }
  }
  return (char_t *)this_local;
}

Assistant:

char_t* parse_question(char_t* s, xml_node_struct*& ref_cursor, unsigned int optmsk, char_t endch)
		{
			// load into registers
			xml_node_struct* cursor = ref_cursor;
			char_t ch = 0;

			// parse node contents, starting with question mark
			++s;

			// read PI target
			char_t* target = s;

			if (!PUGI__IS_CHARTYPE(*s, ct_start_symbol)) PUGI__THROW_ERROR(status_bad_pi, s);

			PUGI__SCANWHILE(PUGI__IS_CHARTYPE(*s, ct_symbol));
			PUGI__CHECK_ERROR(status_bad_pi, s);

			// determine node type; stricmp / strcasecmp is not portable
			bool declaration = (target[0] | ' ') == 'x' && (target[1] | ' ') == 'm' && (target[2] | ' ') == 'l' && target + 3 == s;

			if (declaration ? PUGI__OPTSET(parse_declaration) : PUGI__OPTSET(parse_pi))
			{
				if (declaration)
				{
					// disallow non top-level declarations
					if (cursor->parent) PUGI__THROW_ERROR(status_bad_pi, s);

					PUGI__PUSHNODE(node_declaration);
				}
				else
				{
					PUGI__PUSHNODE(node_pi);
				}

				cursor->name = target;

				PUGI__ENDSEG();

				// parse value/attributes
				if (ch == '?')
				{
					// empty node
					if (!PUGI__ENDSWITH(*s, '>')) PUGI__THROW_ERROR(status_bad_pi, s);
					s += (*s == '>');

					PUGI__POPNODE();
				}
				else if (PUGI__IS_CHARTYPE(ch, ct_space))
				{
					PUGI__SKIPWS();

					// scan for tag end
					char_t* value = s;

					PUGI__SCANFOR(s[0] == '?' && PUGI__ENDSWITH(s[1], '>'));
					PUGI__CHECK_ERROR(status_bad_pi, s);

					if (declaration)
					{
						// replace ending ? with / so that 'element' terminates properly
						*s = '/';

						// we exit from this function with cursor at node_declaration, which is a signal to parse() to go to LOC_ATTRIBUTES
						s = value;
					}
					else
					{
						// store value and step over >
						cursor->value = value;

						PUGI__POPNODE();

						PUGI__ENDSEG();

						s += (*s == '>');
					}
				}
				else PUGI__THROW_ERROR(status_bad_pi, s);
			}
			else
			{
				// scan for tag end
				PUGI__SCANFOR(s[0] == '?' && PUGI__ENDSWITH(s[1], '>'));
				PUGI__CHECK_ERROR(status_bad_pi, s);

				s += (s[1] == '>' ? 2 : 1);
			}

			// store from registers
			ref_cursor = cursor;

			return s;
		}